

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_stringbuilder.cpp
# Opt level: O1

NumberStringBuilder * __thiscall
icu_63::number::impl::NumberStringBuilder::operator=
          (NumberStringBuilder *this,NumberStringBuilder *other)

{
  char16_t *buffer;
  UNumberFormatFields *buffer_00;
  uint uVar1;
  ValueOrHeapArray<char16_t> *__src;
  ValueOrHeapArray<UNumberFormatFields> *__src_00;
  ValueOrHeapArray<char16_t> *__dest;
  ValueOrHeapArray<UNumberFormatFields> *__dest_00;
  NumberStringBuilder local_130;
  
  if (this != other) {
    if (this->fUsingHeap == true) {
      uprv_free_63((this->fChars).heap.ptr);
      uprv_free_63((this->fFields).heap.ptr);
      this->fUsingHeap = false;
    }
    uVar1 = 0x28;
    if (other->fUsingHeap != false) {
      uVar1 = (other->fChars).heap.capacity;
    }
    if (0x28 < (int)uVar1) {
      buffer = (char16_t *)uprv_malloc_63((ulong)uVar1 * 2);
      buffer_00 = (UNumberFormatFields *)uprv_malloc_63((ulong)uVar1 << 2);
      if (buffer_00 == (UNumberFormatFields *)0x0 || buffer == (char16_t *)0x0) {
        uprv_free_63(buffer);
        uprv_free_63(buffer_00);
        local_130.fUsingHeap = false;
        local_130.fZero = 0x14;
        local_130.fLength = 0;
        operator=(this,&local_130);
        ~NumberStringBuilder(&local_130);
        return this;
      }
      this->fUsingHeap = true;
      (this->fChars).heap.capacity = uVar1;
      (this->fChars).heap.ptr = buffer;
      (this->fFields).heap.capacity = uVar1;
      (this->fFields).heap.ptr = buffer_00;
    }
    if (uVar1 != 0) {
      if (other->fUsingHeap == false) {
        __src = &other->fChars;
      }
      else {
        __src = (ValueOrHeapArray<char16_t> *)(other->fChars).heap.ptr;
      }
      if (this->fUsingHeap == false) {
        __dest = &this->fChars;
      }
      else {
        __dest = (ValueOrHeapArray<char16_t> *)(this->fChars).heap.ptr;
      }
      memcpy(__dest,__src,(long)(int)uVar1 * 2);
      if (other->fUsingHeap == false) {
        __src_00 = &other->fFields;
      }
      else {
        __src_00 = (ValueOrHeapArray<UNumberFormatFields> *)(other->fFields).heap.ptr;
      }
      if (this->fUsingHeap == false) {
        __dest_00 = &this->fFields;
      }
      else {
        __dest_00 = (ValueOrHeapArray<UNumberFormatFields> *)(this->fFields).heap.ptr;
      }
      memcpy(__dest_00,__src_00,(long)(int)uVar1 << 2);
    }
    this->fZero = other->fZero;
    this->fLength = other->fLength;
  }
  return this;
}

Assistant:

NumberStringBuilder &NumberStringBuilder::operator=(const NumberStringBuilder &other) {
    // Check for self-assignment
    if (this == &other) {
        return *this;
    }

    // Continue with deallocation and copying
    if (fUsingHeap) {
        uprv_free(fChars.heap.ptr);
        uprv_free(fFields.heap.ptr);
        fUsingHeap = false;
    }

    int32_t capacity = other.getCapacity();
    if (capacity > DEFAULT_CAPACITY) {
        // FIXME: uprv_malloc
        // C++ note: malloc appears in two places: here and in prepareForInsertHelper.
        auto newChars = static_cast<char16_t *> (uprv_malloc(sizeof(char16_t) * capacity));
        auto newFields = static_cast<Field *>(uprv_malloc(sizeof(Field) * capacity));
        if (newChars == nullptr || newFields == nullptr) {
            // UErrorCode is not available; fail silently.
            uprv_free(newChars);
            uprv_free(newFields);
            *this = NumberStringBuilder();  // can't fail
            return *this;
        }

        fUsingHeap = true;
        fChars.heap.capacity = capacity;
        fChars.heap.ptr = newChars;
        fFields.heap.capacity = capacity;
        fFields.heap.ptr = newFields;
    }

    uprv_memcpy2(getCharPtr(), other.getCharPtr(), sizeof(char16_t) * capacity);
    uprv_memcpy2(getFieldPtr(), other.getFieldPtr(), sizeof(Field) * capacity);

    fZero = other.fZero;
    fLength = other.fLength;
    return *this;
}